

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall
wabt::WastLexer::BareToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  Location loc;
  Location local_38;
  TokenType local_14;
  WastLexer *pWStack_10;
  TokenType token_type_local;
  WastLexer *this_local;
  
  local_14 = token_type;
  pWStack_10 = this;
  GetLocation(&local_38,this);
  loc.filename._M_str = local_38.filename._M_str;
  loc.filename._M_len = local_38.filename._M_len;
  loc.field_1.field_1.offset = local_38.field_1.field_1.offset;
  loc.field_1._8_8_ = local_38.field_1._8_8_;
  Token::Token(__return_storage_ptr__,loc,local_14);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::BareToken(TokenType token_type) {
  return Token(GetLocation(), token_type);
}